

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

int __thiscall cmCPackExternalGenerator::PackageFiles(cmCPackExternalGenerator *this)

{
  cmCPackExternalVersionGenerator *pcVar1;
  cmCPackLog *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Value *this_01;
  StreamWriter *pSVar5;
  cmValue cVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  char *local_438 [4];
  string filename;
  Value root;
  StreamWriterBuilder builder;
  ostringstream cmCPackLog_msg;
  ofstream fout;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
  Json::Value::Value((Value *)&fout,"  ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"indentation",(allocator<char> *)&root);
  this_01 = Json::StreamWriterBuilder::operator[](&builder,(String *)&cmCPackLog_msg);
  Json::Value::operator=(this_01,(Value *)&fout);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  Json::Value::~Value((Value *)&fout);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"package.json",(allocator<char> *)&fout);
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&filename);
  }
  std::ofstream::ofstream(&fout,filename._M_dataplus._M_p,_S_out);
  pSVar5 = Json::StreamWriterBuilder::newStreamWriter(&builder);
  Json::Value::Value(&root,objectValue);
  pcVar1 = (this->Generator)._M_t.
           super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           .
           super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
           ._M_head_impl;
  iVar4 = (*pcVar1->_vptr_cmCPackExternalVersionGenerator[2])(pcVar1,&root);
  iVar8 = 0;
  iVar9 = iVar8;
  if ((iVar4 != 0) && (iVar4 = (*pSVar5->_vptr_StreamWriter[2])(pSVar5,&root,&fout), iVar4 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_EXTERNAL_PACKAGE_SCRIPT",
               (allocator<char> *)local_438);
    cVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    iVar4 = 1;
    iVar9 = iVar4;
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(cVar6.Value);
      if (bVar2) {
        bVar2 = cmMakefile::ReadListFile((this->super_cmCPackGenerator).MakefileMap,cVar6.Value);
        bVar3 = cmSystemTools::GetErrorOccurredFlag();
        iVar9 = iVar8;
        if (!bVar3 && bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,"CPACK_EXTERNAL_BUILT_PACKAGES",
                     (allocator<char> *)local_438);
          cVar6 = cmCPackGenerator::GetOption
                            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          iVar9 = iVar4;
          if (cVar6.Value != (string *)0x0) {
            cmList::append(&(this->super_cmCPackGenerator).packageFileNames,cVar6,No);
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path");
        std::endl<char,std::char_traits<char>>(poVar7);
        this_00 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(this_00,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                        ,0x46,local_438[0]);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        iVar9 = 0;
      }
    }
  }
  Json::Value::~Value(&root);
  if (pSVar5 != (StreamWriter *)0x0) {
    (*pSVar5->_vptr_StreamWriter[1])(pSVar5);
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
  return iVar9;
}

Assistant:

int cmCPackExternalGenerator::PackageFiles()
{
  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";

  std::string filename = "package.json";
  if (!this->packageFileNames.empty()) {
    filename = this->packageFileNames[0];
  }

  cmsys::ofstream fout(filename.c_str());
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());

  Json::Value root(Json::objectValue);

  if (!this->Generator->WriteToJSON(root)) {
    return 0;
  }

  if (jout->write(root, &fout)) {
    return 0;
  }

  cmValue packageScript = this->GetOption("CPACK_EXTERNAL_PACKAGE_SCRIPT");
  if (cmNonempty(packageScript)) {
    if (!cmSystemTools::FileIsFullPath(*packageScript)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
          << std::endl);
      return 0;
    }

    bool res = this->MakefileMap->ReadListFile(*packageScript);

    if (cmSystemTools::GetErrorOccurredFlag() || !res) {
      return 0;
    }

    cmValue builtPackages = this->GetOption("CPACK_EXTERNAL_BUILT_PACKAGES");
    if (builtPackages) {
      cmExpandList(builtPackages, this->packageFileNames);
    }
  }

  return 1;
}